

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O3

int DSDcc::DSDSymbol::invert_dibit(int dibit)

{
  int iVar1;
  
  iVar1 = -1;
  if ((uint)dibit < 4) {
    iVar1 = *(int *)(&DAT_00125d00 + (ulong)(uint)dibit * 4);
  }
  return iVar1;
}

Assistant:

int DSDSymbol::invert_dibit(int dibit)
{
    switch (dibit)
    {
    case 0:
        return 2;
    case 1:
        return 3;
    case 2:
        return 0;
    case 3:
        return 1;
    }

    // Error, shouldn't be here
    assert(0);
    return -1;
}